

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

void * malloc_base(void *context,size_t size,stb__alloc_type t,int align)

{
  void *pvVar1;
  uint align_00;
  long *plVar2;
  long *plVar3;
  int iVar4;
  uint uVar5;
  stb__alloc_type sVar6;
  undefined8 *puVar7;
  stb__alloc *src;
  uint size_00;
  
  if (context == (void *)0x0) {
    src = &stb__alloc_global;
  }
  else if (((uint)*(long *)((long)context + -8) & 3) == 1) {
    src = (stb__alloc *)(*(long *)((long)context + -8) + -1);
  }
  else {
    src = (stb__alloc *)((long)context + -0x20);
  }
  size_00 = (uint)size;
  align_00 = align;
  if (align < 1) {
    if ((size & 0xf) == 0) {
      iVar4 = stb_lowbit8::lowbit4[(uint)(size >> 4) & 0xf] + 4;
      if ((size >> 4 & 0xf) == 0) {
        iVar4 = (int)stb_lowbit8::lowbit4[(uint)(size >> 4) & 0xf];
      }
    }
    else {
      iVar4 = (int)stb_lowbit8::lowbit4[size_00 & 0xf];
    }
    uVar5 = 4;
    if (iVar4 != 0x1f) {
      uVar5 = 1 << ((byte)iVar4 & 0x1f);
    }
    align_00 = uVar5;
    if ((align < 0) && (align_00 = -align, SBORROW4(uVar5,-align) != (int)(uVar5 + align) < 0)) {
      align_00 = uVar5;
    }
  }
  if ((align_00 & align_00 - 1) == 0) {
    sVar6 = STB__alloc;
    if ((int)align_00 < 9) {
      sVar6 = t;
    }
    if (t != STB__nochildren) {
      sVar6 = t;
    }
    switch(sVar6) {
    case STB__nochildren:
      plVar2 = (long *)malloc(size + 0x10);
      plVar3 = plVar2;
      if (plVar2 != (long *)0x0) {
        plVar3 = plVar2 + 2;
        plVar2[1] = (long)&src->child;
        pvVar1 = src->child;
        *plVar2 = (long)pvVar1;
        src->child = plVar3;
        if (pvVar1 != (void *)0x0) {
          puVar7 = (undefined8 *)((long)pvVar1 + -0x20);
          if ((*(uint *)((long)pvVar1 + -8) & 3) != 2) {
            puVar7 = (undefined8 *)((long)pvVar1 + -8);
          }
          *puVar7 = plVar2;
        }
      }
      break;
    case STB__chunked:
      if (align_00 < 9) {
        align_00 = 8;
      }
      plVar2 = (long *)stb__alloc_chunk(src,size_00,align_00,8);
      plVar3 = plVar2;
      if (plVar2 != (long *)0x0) {
        *plVar2 = (long)((long)&src->prevn + 1);
        plVar3 = plVar2 + 1;
      }
      break;
    case STB__alloc:
      plVar2 = (long *)malloc(size + 0x20);
      plVar3 = plVar2;
      if (plVar2 != (long *)0x0) {
        plVar2[1] = 0;
        *plVar2 = (long)&src->child;
        pvVar1 = src->child;
        plVar2[2] = (long)pvVar1;
        src->child = plVar2 + 4;
        if (pvVar1 != (void *)0x0) {
          puVar7 = (undefined8 *)((long)pvVar1 + -0x20);
          if ((*(uint *)((long)pvVar1 + -8) & 3) != 2) {
            puVar7 = (undefined8 *)((long)pvVar1 + -8);
          }
          *puVar7 = plVar2 + 2;
        }
        plVar2[3] = 2;
        plVar3 = plVar2 + 4;
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0xb2b,"void *malloc_base(void *, size_t, stb__alloc_type, int)");
    case STB__chunk_raw:
      plVar2 = (long *)stb__alloc_chunk(src,size_00,align_00,0);
      plVar3 = plVar2;
    }
    if (plVar2 == (long *)0x0) {
      plVar3 = (long *)0x0;
    }
    else {
      stb_alloc_count_alloc = stb_alloc_count_alloc + 1;
    }
    return plVar3;
  }
  __assert_fail("stb_is_pow2(align)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                ,0xb01,"void *malloc_base(void *, size_t, stb__alloc_type, int)");
}

Assistant:

static void * malloc_base(void *context, size_t size, stb__alloc_type t, int align)
{
   void *p;

   stb__alloc *src = stb__get_context(context);

   if (align <= 0) {
      // compute worst-case C packed alignment
      // e.g. a 24-byte struct is 8-aligned
      int align_proposed = 1 << stb_lowbit8(size);

      if (align_proposed < 0)
         align_proposed = 4;

      if (align_proposed == 0) {
         if (size == 0)
            align_proposed = 1;
         else
            align_proposed = 256;
      }

      // a negative alignment means 'don't align any larger
      // than this'; so -16 means we align 1,2,4,8, or 16

      if (align < 0) {
         if (align_proposed > -align)
            align_proposed = -align;
      }

      align = align_proposed;
   }

   assert(stb_is_pow2(align));

   // don't cause misalignment when allocating nochildren
   if (t == STB__nochildren && align > 8)
      t = STB__alloc;

   switch (t) {
      case STB__alloc: {
         stb__alloc *s = (stb__alloc *) malloc(size + sizeof(*s));
         if (s == NULL) return NULL;
         p = s+1;
         s->child = NULL;
         stb__insert_alloc(src, s);

         stb__setchunks(s,NULL);
         break;
      }

      case STB__nochildren: {
         stb__nochildren *s = (stb__nochildren *) malloc(size + sizeof(*s));
         if (s == NULL) return NULL;
         p = s+1;
         stb__insert_nochild(src, s);
         break;
      }

      case STB__chunk_raw: {
         p = stb__alloc_chunk(src, size, align, 0);
         if (p == NULL) return NULL;
         break;
      }

      case STB__chunked: {
         stb__chunked *s;
         if (align < sizeof(stb_uintptr)) align = sizeof(stb_uintptr);
         s = (stb__chunked *) stb__alloc_chunk(src, size, align, sizeof(*s));
         if (s == NULL) return NULL;
         stb__setparent(s, src);
         p = s+1;
         break;
      }

      default: p = NULL; assert(0); /* NOTREACHED */
   }

   ++stb_alloc_count_alloc;
   return p;
}